

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O3

void __thiscall CMU462::DynamicScene::Skeleton::drawCapsule(Skeleton *this,Joint *joint)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  GLdouble radius;
  double dVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  pointer ppJVar13;
  double dVar14;
  undefined8 uVar15;
  Skeleton *this_00;
  pointer ppJVar16;
  undefined4 local_88;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  Vector3D local_48;
  
  dVar1 = (joint->super_SceneObject).rotation.x;
  dVar2 = (joint->super_SceneObject).position.x;
  dVar3 = (joint->super_SceneObject).rotation.y;
  dVar4 = (joint->super_SceneObject).position.y;
  dVar5 = (joint->super_SceneObject).rotation.z;
  dVar6 = (joint->super_SceneObject).position.z;
  dVar7 = (joint->super_SceneObject).scale.x;
  dVar8 = (joint->axis).z;
  dVar9 = (joint->super_SceneObject).scale.y;
  radius = joint->capsuleRadius;
  dVar10 = (joint->super_SceneObject).scale.z;
  uVar11 = (joint->axis).x;
  uVar12 = (joint->axis).y;
  dVar14 = SQRT(dVar8 * dVar8 + (double)uVar11 * (double)uVar11 + (double)uVar12 * (double)uVar12);
  uVar15 = gluNewQuadric();
  local_58 = 0x3f8000003f800000;
  uStack_50 = 0x3f8000003f800000;
  local_68 = 0;
  uStack_64 = 0;
  uStack_60 = 0x3e800000;
  uStack_5c = 0x3e800000;
  glEnable(0xb50);
  glEnable(0x4000);
  glLightfv(0x4000,0x1201,&local_58);
  glMaterialfv(0x408,0x1201,&local_68);
  glEnable(0xbe2);
  this_00 = (Skeleton *)0x1;
  glBlendFunc(1,1);
  glPushMatrix();
  glTranslated(SUB84(dVar2,0),SUB84(dVar4,0),dVar6);
  glRotatef((float)dVar1,0x3f800000,0,0);
  glRotatef((float)dVar3,0,0x3f800000,0);
  glRotatef((float)dVar5,0,0,0x3f800000);
  glScalef((float)dVar7,(float)dVar9,(float)dVar10);
  glPushMatrix();
  local_48.x = (double)uVar11;
  local_48.y = (double)uVar12;
  local_48.z = dVar8;
  setZAxis(this_00,&local_48);
  glPushMatrix();
  glRotated(0,0,0,0);
  drawSemisphere(radius,0x19,0x19);
  glPopMatrix();
  gluCylinder(SUB84(radius,0),SUB84(radius,0),dVar14,uVar15,0x19,0x19);
  glPushMatrix();
  glTranslated(0,0,dVar14);
  glRotated(0,0,0,0);
  drawSemisphere(radius,0x19,0x19);
  glPopMatrix();
  glPopMatrix();
  local_88 = (undefined4)uVar11;
  glTranslated(local_88,(int)uVar12,dVar8);
  ppJVar13 = (joint->kids).
             super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (ppJVar16 = (joint->kids).
                  super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppJVar16 != ppJVar13;
      ppJVar16 = ppJVar16 + 1) {
    drawCapsule(this,*ppJVar16);
  }
  glPopMatrix();
  glDisable(0xbe2);
  gluDeleteQuadric(uVar15);
  return;
}

Assistant:

void Skeleton::drawCapsule(Joint * joint)
  {
    Vector3D jointPos = joint->position;
    Vector3D jointRot = joint->rotation;
    Vector3D jointScale = joint->scale;
    Vector3D jointAxis = joint->axis;
    double axisLength = jointAxis.norm();
    double r = joint->capsuleRadius;
    GLUquadric* q = gluNewQuadric();
    GLfloat white[4] = { 1., 1., 1., 1. };
    GLfloat color[4] = { 0., 0., 0.25, .25 };

    glEnable(GL_LIGHTING);
    glEnable(GL_LIGHT0);
    glLightfv(GL_LIGHT0, GL_DIFFUSE, white);
    glMaterialfv(GL_FRONT_AND_BACK, GL_DIFFUSE, color);

    glEnable(GL_BLEND);
    //glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
    glBlendFunc(GL_ONE, GL_ONE);

    glPushMatrix();

    glTranslated(jointPos.x, jointPos.y, jointPos.z);
    glRotatef(jointRot.x, 1.0f, 0.0f, 0.0f);
    glRotatef(jointRot.y, 0.0f, 1.0f, 0.0f);
    glRotatef(jointRot.z, 0.0f, 0.0f, 1.0f);
    glScalef(jointScale.x, jointScale.y, jointScale.z);

    glPushMatrix();
    setZAxis(jointAxis);

    glPushMatrix();
    glRotated(-90, 1, 0, 0);
    drawSemisphere(r, 25, 25);
    glPopMatrix();

    gluCylinder(q, r, r, axisLength, 25, 25);
    
    glPushMatrix();
    glTranslated(0, 0, axisLength);
    glRotated(90, 1, 0, 0);
    drawSemisphere(r, 25, 25);
    glPopMatrix();

    glPopMatrix();

    glTranslated(jointAxis.x, jointAxis.y, jointAxis.z);

    for (Joint* child : joint->kids)
      drawCapsule(child);

    glPopMatrix();

    glDisable(GL_BLEND);
    gluDeleteQuadric(q);
  }